

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<kj::ReadableDirectory::Entry>::setCapacity
          (Vector<kj::ReadableDirectory::Entry> *this,size_t newSize)

{
  __off_t in_RDX;
  ArrayBuilder<kj::ReadableDirectory::Entry> newBuilder;
  ArrayBuilder<kj::ReadableDirectory::Entry> local_30;
  
  if (newSize < (ulong)((long)(this->builder).pos - (long)(this->builder).ptr >> 5)) {
    ArrayBuilder<kj::ReadableDirectory::Entry>::truncate(&this->builder,(char *)newSize,in_RDX);
  }
  local_30.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::ReadableDirectory::Entry>
                           (newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<kj::ReadableDirectory::Entry>::addAll<kj::ArrayBuilder<kj::ReadableDirectory::Entry>>
            (&local_30,&this->builder);
  ArrayBuilder<kj::ReadableDirectory::Entry>::operator=(&this->builder,&local_30);
  ArrayBuilder<kj::ReadableDirectory::Entry>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }